

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack8to4_int8.h
# Opt level: O1

void ncnn::im2col_sgemm_pack8to4_int8_sse(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  uint uVar1;
  int iVar2;
  uint _h;
  uint uVar3;
  void *pvVar4;
  int *piVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [12];
  unkbyte10 Var8;
  undefined1 auVar9 [14];
  undefined1 auVar10 [12];
  unkbyte10 Var11;
  undefined1 auVar12 [14];
  undefined1 auVar13 [12];
  unkbyte10 Var14;
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [14];
  undefined1 auVar24 [12];
  undefined1 auVar25 [14];
  undefined1 auVar26 [12];
  undefined1 auVar27 [14];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  unkbyte10 Var33;
  int iVar34;
  int nn;
  long lVar35;
  undefined1 (*pauVar36) [16];
  ulong uVar37;
  undefined1 (*pauVar38) [16];
  uint uVar39;
  undefined4 *puVar40;
  undefined8 *puVar41;
  ulong uVar42;
  ulong uVar43;
  undefined4 *puVar44;
  long lVar45;
  int iVar46;
  int iVar47;
  undefined8 *puVar48;
  long lVar49;
  ulong uVar50;
  int nn_1;
  undefined1 auVar51 [12];
  short sVar63;
  undefined1 auVar52 [12];
  short sVar61;
  short sVar62;
  undefined1 auVar53 [16];
  int iVar64;
  short sVar78;
  undefined1 auVar65 [12];
  short sVar79;
  int iVar80;
  undefined1 auVar66 [12];
  int iVar77;
  undefined1 auVar67 [16];
  int iVar81;
  short sVar84;
  undefined1 auVar82 [12];
  undefined4 uVar85;
  int iVar86;
  int iVar94;
  short sVar95;
  undefined1 auVar90 [12];
  int iVar96;
  int iVar97;
  short sVar100;
  undefined1 auVar98 [12];
  short sVar103;
  undefined1 auVar101 [12];
  int iVar104;
  short sVar107;
  int iVar108;
  short sVar109;
  short sVar110;
  undefined1 auVar105 [12];
  int iVar111;
  int iVar112;
  int iVar113;
  short sVar119;
  undefined1 auVar115 [12];
  short sVar120;
  short sVar130;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  undefined1 auVar125 [12];
  short sVar135;
  short sVar136;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  int iVar146;
  int iVar159;
  short sVar160;
  undefined1 auVar147 [12];
  int iVar161;
  int iVar162;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar158 [16];
  short sVar163;
  char cVar180;
  char cVar181;
  char cVar182;
  char cVar183;
  char cVar184;
  undefined1 auVar170 [16];
  char cVar179;
  undefined1 auVar171 [16];
  int iVar185;
  int iVar188;
  short sVar189;
  undefined1 auVar186 [12];
  int iVar190;
  int iVar191;
  short sVar201;
  short sVar202;
  short sVar203;
  short sVar204;
  short sVar205;
  undefined1 auVar192 [16];
  undefined1 auVar200 [16];
  undefined1 auVar206 [16];
  Mat tmp;
  undefined1 local_148 [64];
  size_t local_108;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  undefined1 local_c8 [16];
  int local_b8;
  int iStack_b4;
  int iStack_b0;
  int iStack_ac;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar58 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar83 [16];
  undefined6 uVar87;
  undefined8 uVar88;
  undefined1 auVar89 [12];
  undefined1 auVar91 [14];
  undefined1 auVar93 [16];
  undefined1 auVar92 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar114 [12];
  undefined1 auVar117 [16];
  undefined1 auVar116 [14];
  undefined1 auVar118 [16];
  undefined4 uVar121;
  undefined6 uVar122;
  undefined8 uVar123;
  undefined1 auVar124 [12];
  undefined1 auVar126 [14];
  undefined1 auVar127 [14];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar148 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined4 uVar164;
  undefined6 uVar165;
  undefined8 uVar166;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar167 [12];
  undefined1 auVar168 [14];
  undefined1 auVar169 [16];
  undefined1 auVar187 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  
  uVar1 = bottom_im2col->w;
  uVar50 = (ulong)(int)uVar1;
  iVar2 = bottom_im2col->h;
  _h = bottom_im2col->c;
  uVar3 = top_blob->c;
  local_108 = 0;
  local_148._16_8_ = 0;
  local_148._24_4_ = 0;
  local_148._0_8_ = (void *)0x0;
  local_148._8_4_ = 0;
  local_148._12_4_ = 0;
  local_148._48_12_ = SUB1612((undefined1  [16])0x0,4);
  local_148._32_8_ = (Allocator *)0x0;
  local_148._40_4_ = 0;
  local_148._44_4_ = 0;
  uVar39 = (uVar1 & 1) + (uVar1 >> 1);
  if ((long)uVar50 < 2) {
    uVar39 = uVar1;
  }
  Mat::create((Mat *)local_148,iVar2 << (1 < (long)uVar50),_h,uVar39,8,8,opt->workspace_allocator);
  if (0 < (int)uVar1 >> 1) {
    lVar35 = 0;
    uVar37 = 0;
    do {
      if (0 < (int)_h) {
        puVar40 = (undefined4 *)(local_108 * uVar37 * local_148._16_8_ + local_148._0_8_);
        uVar43 = 0;
        do {
          if (0 < iVar2) {
            puVar44 = (undefined4 *)
                      ((long)bottom_im2col->data +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar43 + lVar35);
            iVar46 = iVar2;
            do {
              uVar85 = puVar44[1];
              uVar121 = puVar44[2];
              uVar164 = puVar44[3];
              *puVar40 = *puVar44;
              puVar40[1] = uVar85;
              puVar40[2] = uVar121;
              puVar40[3] = uVar164;
              puVar40 = puVar40 + 4;
              puVar44 = puVar44 + uVar50 * 2;
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          uVar43 = uVar43 + 1;
        } while (uVar43 != _h);
      }
      uVar37 = uVar37 + 1;
      lVar35 = lVar35 + 0x10;
    } while (uVar37 != (uint)((int)uVar1 >> 1));
  }
  uVar37 = uVar50 & 0xfffffffffffffffe;
  if ((uint)uVar37 != uVar1) {
    lVar35 = uVar37 * 8;
    do {
      if (0 < (int)_h) {
        uVar39 = ((uint)(uVar37 >> 0x1f) & 1) + (int)uVar37;
        puVar41 = (undefined8 *)
                  ((long)(int)(((int)uVar39 >> 1) + ((int)uVar37 - (uVar39 & 0xfffffffe))) *
                   local_108 * local_148._16_8_ + local_148._0_8_);
        pvVar4 = bottom_im2col->data;
        uVar43 = 0;
        do {
          if (0 < iVar2) {
            puVar48 = (undefined8 *)
                      ((long)pvVar4 +
                      bottom_im2col->cstep * bottom_im2col->elemsize * uVar43 + lVar35);
            iVar46 = iVar2;
            do {
              *puVar41 = *puVar48;
              puVar41 = puVar41 + 1;
              puVar48 = puVar48 + uVar50;
              iVar46 = iVar46 + -1;
            } while (iVar46 != 0);
          }
          uVar43 = uVar43 + 1;
        } while (uVar43 != _h);
      }
      uVar37 = uVar37 + 1;
      lVar35 = lVar35 + 8;
    } while ((long)uVar37 < (long)uVar50);
  }
  if (0 < (int)uVar3) {
    iVar46 = _h * iVar2;
    uVar37 = 0;
    do {
      pauVar36 = (undefined1 (*) [16])
                 (top_blob->cstep * uVar37 * top_blob->elemsize + (long)top_blob->data);
      if ((int)uVar1 < 2) {
        uVar43 = 0;
      }
      else {
        lVar35 = 0;
        uVar42 = 0;
        do {
          if (iVar46 < 1) {
            auVar137 = (undefined1  [16])0x0;
            iVar64 = 0;
            iVar77 = 0;
            iVar80 = 0;
            iVar81 = 0;
            iVar86 = 0;
            iVar94 = 0;
            iVar96 = 0;
            iVar97 = 0;
            auVar200 = (undefined1  [16])0x0;
            iVar104 = 0;
            iVar108 = 0;
            iVar111 = 0;
            iVar112 = 0;
            iVar185 = 0;
            iVar188 = 0;
            iVar190 = 0;
            iVar191 = 0;
            auVar206 = (undefined1  [16])0x0;
            iVar146 = 0;
            iVar159 = 0;
            iVar161 = 0;
            iVar162 = 0;
          }
          else {
            lVar45 = kernel->cstep * uVar37 * kernel->elemsize;
            lVar49 = 0;
            local_f8 = (undefined1  [16])0x0;
            auVar137 = (undefined1  [16])0x0;
            auVar200 = ZEXT816(0);
            auVar206 = ZEXT816(0);
            iVar47 = iVar46;
            iVar104 = 0;
            iVar108 = 0;
            iVar111 = 0;
            iVar112 = 0;
            iVar64 = 0;
            iVar77 = 0;
            iVar80 = 0;
            iVar81 = 0;
            iVar185 = 0;
            iVar188 = 0;
            iVar190 = 0;
            iVar191 = 0;
            iVar146 = 0;
            iVar159 = 0;
            iVar161 = 0;
            iVar162 = 0;
            do {
              iStack_6c = iVar162;
              iStack_70 = iVar161;
              iStack_74 = iVar159;
              local_78 = iVar146;
              iStack_5c = iVar191;
              iStack_60 = iVar190;
              iStack_64 = iVar188;
              local_68 = iVar185;
              iStack_cc = iVar81;
              iStack_d0 = iVar80;
              iStack_d4 = iVar77;
              local_d8 = iVar64;
              iStack_ac = iVar112;
              iStack_b0 = iVar111;
              iStack_b4 = iVar108;
              local_b8 = iVar104;
              local_c8 = auVar206;
              local_58 = auVar200;
              local_48 = auVar137;
              auVar137 = *(undefined1 (*) [16])
                          (local_148._0_8_ + lVar49 + local_108 * local_148._16_8_ * lVar35);
              auVar199._0_14_ = auVar137._0_14_;
              auVar199[0xe] = auVar137[7];
              auVar199[0xf] = -(auVar137[7] < '\0');
              auVar198._14_2_ = auVar199._14_2_;
              auVar198._0_13_ = auVar137._0_13_;
              auVar198[0xd] = -(auVar137[6] < '\0');
              auVar197._13_3_ = auVar198._13_3_;
              auVar197._0_12_ = auVar137._0_12_;
              auVar197[0xc] = auVar137[6];
              auVar196._12_4_ = auVar197._12_4_;
              auVar196._0_11_ = auVar137._0_11_;
              auVar196[0xb] = -(auVar137[5] < '\0');
              auVar195._11_5_ = auVar196._11_5_;
              auVar195._0_10_ = auVar137._0_10_;
              auVar195[10] = auVar137[5];
              auVar194._10_6_ = auVar195._10_6_;
              auVar194._0_9_ = auVar137._0_9_;
              auVar194[9] = -(auVar137[4] < '\0');
              auVar193._9_7_ = auVar194._9_7_;
              auVar193._0_8_ = auVar137._0_8_;
              auVar193[8] = auVar137[4];
              Var8 = CONCAT91(CONCAT81(auVar193._8_8_,-(auVar137[3] < '\0')),auVar137[3]);
              auVar7._2_10_ = Var8;
              auVar7[1] = -(auVar137[2] < '\0');
              auVar7[0] = auVar137[2];
              auVar6._2_12_ = auVar7;
              auVar6[1] = -(auVar137[1] < '\0');
              auVar6[0] = auVar137[1];
              auVar192._0_2_ = CONCAT11(-(auVar137[0] < '\0'),auVar137[0]);
              auVar192._2_14_ = auVar6;
              sVar120 = CONCAT11(-(auVar137[8] < '\0'),auVar137[8]);
              uVar121 = CONCAT13(-(auVar137[9] < '\0'),CONCAT12(auVar137[9],sVar120));
              uVar122 = CONCAT15(-(auVar137[10] < '\0'),CONCAT14(auVar137[10],uVar121));
              uVar123 = CONCAT17(-(auVar137[0xb] < '\0'),CONCAT16(auVar137[0xb],uVar122));
              auVar124._0_10_ = CONCAT19(-(auVar137[0xc] < '\0'),CONCAT18(auVar137[0xc],uVar123));
              auVar124[10] = auVar137[0xd];
              auVar124[0xb] = -(auVar137[0xd] < '\0');
              auVar126[0xc] = auVar137[0xe];
              auVar126._0_12_ = auVar124;
              auVar126[0xd] = -(auVar137[0xe] < '\0');
              auVar128[0xe] = auVar137[0xf];
              auVar128._0_14_ = auVar126;
              auVar128[0xf] = -(auVar137[0xf] < '\0');
              auVar137 = *(undefined1 (*) [16])((long)kernel->data + lVar49 * 2 + lVar45);
              auVar200 = *(undefined1 (*) [16])((long)kernel->data + lVar49 * 2 + lVar45 + 0x10);
              auVar58._0_14_ = auVar137._0_14_;
              auVar58[0xe] = auVar137[7];
              auVar58[0xf] = -(auVar137[7] < '\0');
              auVar158._14_2_ = auVar58._14_2_;
              auVar158._0_13_ = auVar137._0_13_;
              auVar158[0xd] = -(auVar137[6] < '\0');
              auVar57._13_3_ = auVar158._13_3_;
              auVar57._0_12_ = auVar137._0_12_;
              auVar57[0xc] = auVar137[6];
              auVar56._12_4_ = auVar57._12_4_;
              auVar56._0_11_ = auVar137._0_11_;
              auVar56[0xb] = -(auVar137[5] < '\0');
              auVar55._11_5_ = auVar56._11_5_;
              auVar55._0_10_ = auVar137._0_10_;
              auVar55[10] = auVar137[5];
              auVar170._10_6_ = auVar55._10_6_;
              auVar170._0_9_ = auVar137._0_9_;
              auVar170[9] = -(auVar137[4] < '\0');
              auVar54._9_7_ = auVar170._9_7_;
              auVar54._0_8_ = auVar137._0_8_;
              auVar54[8] = auVar137[4];
              Var11 = CONCAT91(CONCAT81(auVar54._8_8_,-(auVar137[3] < '\0')),auVar137[3]);
              auVar10._2_10_ = Var11;
              auVar10[1] = -(auVar137[2] < '\0');
              auVar10[0] = auVar137[2];
              auVar9._2_12_ = auVar10;
              auVar9[1] = -(auVar137[1] < '\0');
              auVar9[0] = auVar137[1];
              auVar53._0_2_ = CONCAT11(-(auVar137[0] < '\0'),auVar137[0]);
              auVar53._2_14_ = auVar9;
              sVar100 = CONCAT11(-(auVar137[8] < '\0'),auVar137[8]);
              uVar85 = CONCAT13(-(auVar137[9] < '\0'),CONCAT12(auVar137[9],sVar100));
              uVar87 = CONCAT15(-(auVar137[10] < '\0'),CONCAT14(auVar137[10],uVar85));
              uVar88 = CONCAT17(-(auVar137[0xb] < '\0'),CONCAT16(auVar137[0xb],uVar87));
              auVar89._0_10_ = CONCAT19(-(auVar137[0xc] < '\0'),CONCAT18(auVar137[0xc],uVar88));
              auVar89[10] = auVar137[0xd];
              auVar89[0xb] = -(auVar137[0xd] < '\0');
              auVar91[0xc] = auVar137[0xe];
              auVar91._0_12_ = auVar89;
              auVar91[0xd] = -(auVar137[0xe] < '\0');
              auVar92[0xe] = auVar137[0xf];
              auVar92._0_14_ = auVar91;
              auVar92[0xf] = -(auVar137[0xf] < '\0');
              auVar74._0_14_ = auVar200._0_14_;
              auVar74[0xe] = auVar200[7];
              auVar74[0xf] = -(auVar200[7] < '\0');
              auVar73._14_2_ = auVar74._14_2_;
              auVar73._0_13_ = auVar200._0_13_;
              auVar73[0xd] = -(auVar200[6] < '\0');
              auVar72._13_3_ = auVar73._13_3_;
              auVar72._0_12_ = auVar200._0_12_;
              auVar72[0xc] = auVar200[6];
              auVar71._12_4_ = auVar72._12_4_;
              auVar71._0_11_ = auVar200._0_11_;
              auVar71[0xb] = -(auVar200[5] < '\0');
              auVar70._11_5_ = auVar71._11_5_;
              auVar70._0_10_ = auVar200._0_10_;
              auVar70[10] = auVar200[5];
              auVar69._10_6_ = auVar70._10_6_;
              auVar69._0_9_ = auVar200._0_9_;
              auVar69[9] = -(auVar200[4] < '\0');
              auVar68._9_7_ = auVar69._9_7_;
              auVar68._0_8_ = auVar200._0_8_;
              auVar68[8] = auVar200[4];
              Var14 = CONCAT91(CONCAT81(auVar68._8_8_,-(auVar200[3] < '\0')),auVar200[3]);
              auVar13._2_10_ = Var14;
              auVar13[1] = -(auVar200[2] < '\0');
              auVar13[0] = auVar200[2];
              auVar12._2_12_ = auVar13;
              auVar12[1] = -(auVar200[1] < '\0');
              auVar12[0] = auVar200[1];
              auVar67._0_2_ = CONCAT11(-(auVar200[0] < '\0'),auVar200[0]);
              auVar67._2_14_ = auVar12;
              sVar163 = CONCAT11(-(auVar200[8] < '\0'),auVar200[8]);
              uVar164 = CONCAT13(-(auVar200[9] < '\0'),CONCAT12(auVar200[9],sVar163));
              uVar165 = CONCAT15(-(auVar200[10] < '\0'),CONCAT14(auVar200[10],uVar164));
              uVar166 = CONCAT17(-(auVar200[0xb] < '\0'),CONCAT16(auVar200[0xb],uVar165));
              auVar167._0_10_ = CONCAT19(-(auVar200[0xc] < '\0'),CONCAT18(auVar200[0xc],uVar166));
              auVar167[10] = auVar200[0xd];
              auVar167[0xb] = -(auVar200[0xd] < '\0');
              auVar168[0xc] = auVar200[0xe];
              auVar168._0_12_ = auVar167;
              auVar168[0xd] = -(auVar200[0xe] < '\0');
              auVar169[0xe] = auVar200[0xf];
              auVar169._0_14_ = auVar168;
              auVar169[0xf] = -(auVar200[0xf] < '\0');
              sVar201 = auVar6._0_2_;
              sVar202 = auVar7._0_2_;
              sVar61 = (short)Var11;
              sVar109 = (short)Var8;
              sVar160 = sVar61 * sVar109;
              sVar203 = auVar193._8_2_;
              sVar204 = auVar195._10_2_;
              sVar205 = auVar197._12_2_;
              auVar206 = pmulhw(auVar192,auVar53);
              sVar62 = (short)((uint)uVar85 >> 0x10);
              sVar63 = (short)((uint6)uVar87 >> 0x20);
              sVar95 = (short)((ulong)uVar88 >> 0x30);
              sVar103 = sVar95 * sVar109;
              sVar79 = (short)((unkuint10)auVar89._0_10_ >> 0x40);
              local_e8 = pmulhw(auVar192,auVar92);
              sVar78 = (short)Var14;
              sVar189 = sVar78 * sVar109;
              auVar137 = pmulhw(auVar192,auVar67);
              sVar84 = (short)((uint)uVar164 >> 0x10);
              sVar107 = (short)((uint6)uVar165 >> 0x20);
              sVar119 = (short)((ulong)uVar166 >> 0x30);
              sVar109 = sVar119 * sVar109;
              sVar110 = (short)((unkuint10)auVar167._0_10_ >> 0x40);
              auVar200 = pmulhw(auVar192,auVar169);
              local_88 = pmulhw(auVar128,auVar53);
              sVar130 = (short)((uint)uVar121 >> 0x10);
              sVar131 = (short)((uint6)uVar122 >> 0x20);
              sVar132 = (short)((ulong)uVar123 >> 0x30);
              sVar61 = sVar61 * sVar132;
              sVar133 = (short)((unkuint10)auVar124._0_10_ >> 0x40);
              sVar134 = auVar124._10_2_;
              sVar135 = auVar126._12_2_;
              sVar136 = auVar128._14_2_;
              local_98 = pmulhw(auVar128,auVar92);
              sVar95 = sVar95 * sVar132;
              local_a8 = pmulhw(auVar128,auVar67);
              sVar78 = sVar78 * sVar132;
              sVar119 = sVar119 * sVar132;
              auVar170 = pmulhw(auVar169,auVar128);
              iVar104 = CONCAT22(auVar206._6_2_,sVar160);
              Var8 = CONCAT64(CONCAT42(iVar104,auVar206._4_2_),
                              CONCAT22(auVar10._0_2_ * sVar202,sVar160));
              auVar15._4_8_ = (long)((unkuint10)Var8 >> 0x10);
              auVar15._2_2_ = auVar206._2_2_;
              auVar15._0_2_ = auVar9._0_2_ * sVar201;
              iVar108 = CONCAT22(local_e8._6_2_,sVar103);
              Var11 = CONCAT64(CONCAT42(iVar108,local_e8._4_2_),CONCAT22(sVar63 * sVar202,sVar103));
              auVar16._4_8_ = (long)((unkuint10)Var11 >> 0x10);
              auVar16._2_2_ = local_e8._2_2_;
              auVar16._0_2_ = sVar62 * sVar201;
              iVar111 = CONCAT22(auVar137._6_2_,sVar189);
              Var14 = CONCAT64(CONCAT42(iVar111,auVar137._4_2_),
                               CONCAT22(auVar13._0_2_ * sVar202,sVar189));
              auVar17._4_8_ = (long)((unkuint10)Var14 >> 0x10);
              auVar17._2_2_ = auVar137._2_2_;
              auVar17._0_2_ = auVar12._0_2_ * sVar201;
              iVar112 = CONCAT22(auVar200._6_2_,sVar109);
              Var33 = CONCAT64(CONCAT42(iVar112,auVar200._4_2_),CONCAT22(sVar107 * sVar202,sVar109))
              ;
              auVar18._4_8_ = (long)((unkuint10)Var33 >> 0x10);
              auVar18._2_2_ = auVar200._2_2_;
              auVar18._0_2_ = sVar84 * sVar201;
              iVar146 = CONCAT22(auVar206._8_2_,auVar54._8_2_ * sVar203);
              auVar147._0_8_ = CONCAT26(auVar206._10_2_,CONCAT24(auVar55._10_2_ * sVar204,iVar146));
              auVar147._8_2_ = auVar57._12_2_ * sVar205;
              auVar147._10_2_ = auVar206._12_2_;
              auVar148._12_2_ = auVar158._14_2_ * auVar198._14_2_;
              auVar148._0_12_ = auVar147;
              auVar148._14_2_ = auVar206._14_2_;
              iVar146 = iVar146 + CONCAT22(auVar206._0_2_,auVar53._0_2_ * auVar192._0_2_) + local_78
              ;
              iVar159 = (int)((ulong)auVar147._0_8_ >> 0x20) + auVar15._0_4_ + iStack_74;
              iVar161 = auVar147._8_4_ + (int)((unkuint10)Var8 >> 0x10) + iStack_70;
              iVar162 = auVar148._12_4_ + iVar104 + iStack_6c;
              iVar104 = CONCAT22(local_e8._8_2_,sVar79 * sVar203);
              auVar101._0_8_ = CONCAT26(local_e8._10_2_,CONCAT24(auVar89._10_2_ * sVar204,iVar104));
              auVar101._8_2_ = auVar91._12_2_ * sVar205;
              auVar101._10_2_ = local_e8._12_2_;
              auVar102._12_2_ = auVar92._14_2_ * auVar198._14_2_;
              auVar102._0_12_ = auVar101;
              auVar102._14_2_ = local_e8._14_2_;
              auVar206._0_4_ =
                   iVar104 + CONCAT22(local_e8._0_2_,sVar100 * auVar192._0_2_) + local_c8._0_4_;
              auVar206._4_4_ = (int)((ulong)auVar101._0_8_ >> 0x20) + auVar16._0_4_ + local_c8._4_4_
              ;
              auVar206._8_4_ = auVar101._8_4_ + (int)((unkuint10)Var11 >> 0x10) + local_c8._8_4_;
              auVar206._12_4_ = auVar102._12_4_ + iVar108 + local_c8._12_4_;
              iVar185 = CONCAT22(auVar137._8_2_,auVar68._8_2_ * sVar203);
              auVar186._0_8_ = CONCAT26(auVar137._10_2_,CONCAT24(auVar70._10_2_ * sVar204,iVar185));
              auVar186._8_2_ = auVar72._12_2_ * sVar205;
              auVar186._10_2_ = auVar137._12_2_;
              auVar187._12_2_ = auVar73._14_2_ * auVar198._14_2_;
              auVar187._0_12_ = auVar186;
              auVar187._14_2_ = auVar137._14_2_;
              iVar185 = iVar185 + CONCAT22(auVar137._0_2_,auVar67._0_2_ * auVar192._0_2_) + local_68
              ;
              iVar188 = (int)((ulong)auVar186._0_8_ >> 0x20) + auVar17._0_4_ + iStack_64;
              iVar190 = auVar186._8_4_ + (int)((unkuint10)Var14 >> 0x10) + iStack_60;
              iVar191 = auVar187._12_4_ + iVar111 + iStack_5c;
              iVar104 = CONCAT22(auVar200._8_2_,sVar110 * sVar203);
              auVar105._0_8_ = CONCAT26(auVar200._10_2_,CONCAT24(auVar167._10_2_ * sVar204,iVar104))
              ;
              auVar105._8_2_ = auVar168._12_2_ * sVar205;
              auVar105._10_2_ = auVar200._12_2_;
              auVar106._12_2_ = auVar169._14_2_ * auVar198._14_2_;
              auVar106._0_12_ = auVar105;
              auVar106._14_2_ = auVar200._14_2_;
              iVar104 = iVar104 + CONCAT22(auVar200._0_2_,sVar163 * auVar192._0_2_) + local_b8;
              iVar108 = (int)((ulong)auVar105._0_8_ >> 0x20) + auVar18._0_4_ + iStack_b4;
              iVar111 = auVar105._8_4_ + (int)((unkuint10)Var33 >> 0x10) + iStack_b0;
              iVar112 = auVar106._12_4_ + iVar112 + iStack_ac;
              iVar64 = CONCAT22(local_88._6_2_,sVar61);
              Var8 = CONCAT64(CONCAT42(iVar64,local_88._4_2_),
                              CONCAT22(auVar10._0_2_ * sVar131,sVar61));
              auVar19._4_8_ = (long)((unkuint10)Var8 >> 0x10);
              auVar19._2_2_ = local_88._2_2_;
              auVar19._0_2_ = auVar9._0_2_ * sVar130;
              iVar77 = CONCAT22(local_98._6_2_,sVar95);
              Var11 = CONCAT64(CONCAT42(iVar77,local_98._4_2_),CONCAT22(sVar63 * sVar131,sVar95));
              auVar20._4_8_ = (long)((unkuint10)Var11 >> 0x10);
              auVar20._2_2_ = local_98._2_2_;
              auVar20._0_2_ = sVar62 * sVar130;
              iVar81 = CONCAT22(local_a8._6_2_,sVar78);
              Var14 = CONCAT64(CONCAT42(iVar81,local_a8._4_2_),
                               CONCAT22(auVar13._0_2_ * sVar131,sVar78));
              auVar21._4_8_ = (long)((unkuint10)Var14 >> 0x10);
              auVar21._2_2_ = local_a8._2_2_;
              auVar21._0_2_ = auVar12._0_2_ * sVar130;
              iVar34 = CONCAT22(auVar170._6_2_,sVar119);
              Var33 = CONCAT64(CONCAT42(iVar34,auVar170._4_2_),CONCAT22(sVar107 * sVar131,sVar119));
              auVar22._4_8_ = (long)((unkuint10)Var33 >> 0x10);
              auVar22._2_2_ = auVar170._2_2_;
              auVar22._0_2_ = sVar84 * sVar130;
              iVar80 = CONCAT22(local_88._8_2_,auVar54._8_2_ * sVar133);
              auVar51._0_8_ = CONCAT26(local_88._10_2_,CONCAT24(auVar55._10_2_ * sVar134,iVar80));
              auVar51._8_2_ = auVar57._12_2_ * sVar135;
              auVar51._10_2_ = local_88._12_2_;
              auVar59._12_2_ = auVar158._14_2_ * sVar136;
              auVar59._0_12_ = auVar51;
              auVar59._14_2_ = local_88._14_2_;
              auVar200._0_4_ =
                   iVar80 + CONCAT22(local_88._0_2_,auVar53._0_2_ * sVar120) + local_58._0_4_;
              auVar200._4_4_ = (int)((ulong)auVar51._0_8_ >> 0x20) + auVar19._0_4_ + local_58._4_4_;
              auVar200._8_4_ = auVar51._8_4_ + (int)((unkuint10)Var8 >> 0x10) + local_58._8_4_;
              auVar200._12_4_ = auVar59._12_4_ + iVar64 + local_58._12_4_;
              iVar86 = CONCAT22(local_98._8_2_,sVar79 * sVar133);
              auVar90._0_8_ = CONCAT26(local_98._10_2_,CONCAT24(auVar89._10_2_ * sVar134,iVar86));
              auVar90._8_2_ = auVar91._12_2_ * sVar135;
              auVar90._10_2_ = local_98._12_2_;
              auVar93._12_2_ = auVar92._14_2_ * sVar136;
              auVar93._0_12_ = auVar90;
              auVar93._14_2_ = local_98._14_2_;
              iVar86 = iVar86 + CONCAT22(local_98._0_2_,sVar100 * sVar120) + local_f8._0_4_;
              iVar94 = (int)((ulong)auVar90._0_8_ >> 0x20) + auVar20._0_4_ + local_f8._4_4_;
              iVar96 = auVar90._8_4_ + (int)((unkuint10)Var11 >> 0x10) + local_f8._8_4_;
              iVar97 = auVar93._12_4_ + iVar77 + local_f8._12_4_;
              iVar64 = CONCAT22(local_a8._8_2_,auVar68._8_2_ * sVar133);
              auVar65._0_8_ = CONCAT26(local_a8._10_2_,CONCAT24(auVar70._10_2_ * sVar134,iVar64));
              auVar65._8_2_ = auVar72._12_2_ * sVar135;
              auVar65._10_2_ = local_a8._12_2_;
              auVar75._12_2_ = auVar73._14_2_ * sVar136;
              auVar75._0_12_ = auVar65;
              auVar75._14_2_ = local_a8._14_2_;
              iVar64 = iVar64 + CONCAT22(local_a8._0_2_,auVar67._0_2_ * sVar120) + local_d8;
              iVar77 = (int)((ulong)auVar65._0_8_ >> 0x20) + auVar21._0_4_ + iStack_d4;
              iVar80 = auVar65._8_4_ + (int)((unkuint10)Var14 >> 0x10) + iStack_d0;
              iVar81 = auVar75._12_4_ + iVar81 + iStack_cc;
              iVar113 = CONCAT22(auVar170._8_2_,sVar110 * sVar133);
              auVar114._0_8_ = CONCAT26(auVar170._10_2_,CONCAT24(auVar167._10_2_ * sVar134,iVar113))
              ;
              auVar114._8_2_ = auVar168._12_2_ * sVar135;
              auVar114._10_2_ = auVar170._12_2_;
              auVar117._12_2_ = auVar169._14_2_ * sVar136;
              auVar117._0_12_ = auVar114;
              auVar117._14_2_ = auVar170._14_2_;
              auVar137._0_4_ = iVar113 + CONCAT22(auVar170._0_2_,sVar163 * sVar120) + local_48._0_4_
              ;
              auVar137._4_4_ = (int)((ulong)auVar114._0_8_ >> 0x20) + auVar22._0_4_ + local_48._4_4_
              ;
              auVar137._8_4_ = auVar114._8_4_ + (int)((unkuint10)Var33 >> 0x10) + local_48._8_4_;
              auVar137._12_4_ = auVar117._12_4_ + iVar34 + local_48._12_4_;
              lVar49 = lVar49 + 0x10;
              local_f8._4_4_ = iVar94;
              local_f8._0_4_ = iVar86;
              local_f8._8_4_ = iVar96;
              local_f8._12_4_ = iVar97;
              iVar47 = iVar47 + -1;
            } while (iVar47 != 0);
          }
          auVar149._0_4_ = iVar162 + iVar161 + iVar159 + iVar146;
          auVar149._4_4_ = auVar206._12_4_ + auVar206._8_4_ + auVar206._4_4_ + auVar206._0_4_;
          auVar149._8_4_ = iVar191 + iVar190 + iVar188 + iVar185;
          auVar149._12_4_ = iVar112 + iVar111 + iVar108 + iVar104;
          *pauVar36 = auVar149;
          *(int *)pauVar36[1] = auVar200._12_4_ + auVar200._8_4_ + auVar200._4_4_ + auVar200._0_4_;
          *(int *)(pauVar36[1] + 4) = iVar97 + iVar96 + iVar94 + iVar86;
          *(int *)(pauVar36[1] + 8) = iVar81 + iVar80 + iVar77 + iVar64;
          *(int *)(pauVar36[1] + 0xc) =
               auVar137._12_4_ + auVar137._8_4_ + auVar137._4_4_ + auVar137._0_4_;
          pauVar36 = pauVar36 + 2;
          uVar43 = uVar42 + 2;
          lVar45 = uVar42 + 3;
          lVar35 = lVar35 + 1;
          uVar42 = uVar43;
        } while (lVar45 < (long)uVar50);
      }
      if ((int)uVar43 < (int)uVar1) {
        do {
          if ((int)(_h * iVar2) < 1) {
            iVar104 = 0;
            iVar108 = 0;
            iVar111 = 0;
            iVar112 = 0;
            iVar185 = 0;
            iVar188 = 0;
            iVar190 = 0;
            iVar191 = 0;
            iVar64 = 0;
            iVar77 = 0;
            iVar80 = 0;
            iVar81 = 0;
            iVar146 = 0;
            iVar159 = 0;
            iVar161 = 0;
            iVar162 = 0;
          }
          else {
            pauVar38 = (undefined1 (*) [16])
                       (kernel->cstep * uVar37 * kernel->elemsize + (long)kernel->data);
            iVar146 = 0;
            iVar159 = 0;
            iVar161 = 0;
            iVar162 = 0;
            lVar35 = 0;
            iVar64 = 0;
            iVar77 = 0;
            iVar80 = 0;
            iVar81 = 0;
            iVar185 = 0;
            iVar188 = 0;
            iVar190 = 0;
            iVar191 = 0;
            iVar104 = 0;
            iVar108 = 0;
            iVar111 = 0;
            iVar112 = 0;
            do {
              uVar42 = *(ulong *)(local_148._0_8_ +
                                 lVar35 * 8 +
                                 local_108 * local_148._16_8_ *
                                 (ulong)(((uint)uVar43 & 1) + ((uint)(uVar43 >> 1) & 0x7fffffff)));
              cVar179 = (char)(uVar42 >> 8);
              cVar180 = (char)(uVar42 >> 0x10);
              cVar181 = (char)(uVar42 >> 0x18);
              cVar182 = (char)(uVar42 >> 0x20);
              cVar183 = (char)(uVar42 >> 0x28);
              cVar184 = (char)(uVar42 >> 0x30);
              auVar178._8_6_ = 0;
              auVar178._0_8_ = uVar42;
              auVar178[0xe] = (char)(uVar42 >> 0x38);
              auVar178[0xf] = -((long)uVar42 < 0);
              auVar177._14_2_ = auVar178._14_2_;
              auVar177._8_5_ = 0;
              auVar177._0_8_ = uVar42;
              auVar177[0xd] = -(cVar184 < '\0');
              auVar176._13_3_ = auVar177._13_3_;
              auVar176._8_4_ = 0;
              auVar176._0_8_ = uVar42;
              auVar176[0xc] = cVar184;
              auVar175._12_4_ = auVar176._12_4_;
              auVar175._8_3_ = 0;
              auVar175._0_8_ = uVar42;
              auVar175[0xb] = -(cVar183 < '\0');
              auVar174._11_5_ = auVar175._11_5_;
              auVar174._8_2_ = 0;
              auVar174._0_8_ = uVar42;
              auVar174[10] = cVar183;
              auVar173._10_6_ = auVar174._10_6_;
              auVar173[8] = 0;
              auVar173._0_8_ = uVar42;
              auVar173[9] = -(cVar182 < '\0');
              auVar172._9_7_ = auVar173._9_7_;
              auVar172[8] = cVar182;
              auVar172._0_8_ = uVar42;
              Var8 = CONCAT91(CONCAT81(auVar172._8_8_,-(cVar181 < '\0')),cVar181);
              auVar24._2_10_ = Var8;
              auVar24[1] = -(cVar180 < '\0');
              auVar24[0] = cVar180;
              auVar23._2_12_ = auVar24;
              auVar23[1] = -(cVar179 < '\0');
              auVar23[0] = cVar179;
              auVar171._0_2_ = CONCAT11(-((char)uVar42 < '\0'),(char)uVar42);
              auVar171._2_14_ = auVar23;
              auVar137 = *pauVar38;
              auVar200 = pauVar38[1];
              auVar157._0_14_ = auVar137._0_14_;
              auVar157[0xe] = auVar137[7];
              auVar157[0xf] = -(auVar137[7] < '\0');
              auVar156._14_2_ = auVar157._14_2_;
              auVar156._0_13_ = auVar137._0_13_;
              auVar156[0xd] = -(auVar137[6] < '\0');
              auVar155._13_3_ = auVar156._13_3_;
              auVar155._0_12_ = auVar137._0_12_;
              auVar155[0xc] = auVar137[6];
              auVar154._12_4_ = auVar155._12_4_;
              auVar154._0_11_ = auVar137._0_11_;
              auVar154[0xb] = -(auVar137[5] < '\0');
              auVar153._11_5_ = auVar154._11_5_;
              auVar153._0_10_ = auVar137._0_10_;
              auVar153[10] = auVar137[5];
              auVar152._10_6_ = auVar153._10_6_;
              auVar152._0_9_ = auVar137._0_9_;
              auVar152[9] = -(auVar137[4] < '\0');
              auVar151._9_7_ = auVar152._9_7_;
              auVar151._0_8_ = auVar137._0_8_;
              auVar151[8] = auVar137[4];
              Var11 = CONCAT91(CONCAT81(auVar151._8_8_,-(auVar137[3] < '\0')),auVar137[3]);
              auVar26._2_10_ = Var11;
              auVar26[1] = -(auVar137[2] < '\0');
              auVar26[0] = auVar137[2];
              auVar25._2_12_ = auVar26;
              auVar25[1] = -(auVar137[1] < '\0');
              auVar25[0] = auVar137[1];
              auVar150._0_2_ = CONCAT11(-(auVar137[0] < '\0'),auVar137[0]);
              auVar150._2_14_ = auVar25;
              sVar109 = CONCAT11(-(auVar137[8] < '\0'),auVar137[8]);
              uVar121 = CONCAT13(-(auVar137[9] < '\0'),CONCAT12(auVar137[9],sVar109));
              uVar122 = CONCAT15(-(auVar137[10] < '\0'),CONCAT14(auVar137[10],uVar121));
              uVar123 = CONCAT17(-(auVar137[0xb] < '\0'),CONCAT16(auVar137[0xb],uVar122));
              auVar125._0_10_ = CONCAT19(-(auVar137[0xc] < '\0'),CONCAT18(auVar137[0xc],uVar123));
              auVar125[10] = auVar137[0xd];
              auVar125[0xb] = -(auVar137[0xd] < '\0');
              auVar127[0xc] = auVar137[0xe];
              auVar127._0_12_ = auVar125;
              auVar127[0xd] = -(auVar137[0xe] < '\0');
              auVar129[0xe] = auVar137[0xf];
              auVar129._0_14_ = auVar127;
              auVar129[0xf] = -(auVar137[0xf] < '\0');
              auVar145._0_14_ = auVar200._0_14_;
              auVar145[0xe] = auVar200[7];
              auVar145[0xf] = -(auVar200[7] < '\0');
              auVar144._14_2_ = auVar145._14_2_;
              auVar144._0_13_ = auVar200._0_13_;
              auVar144[0xd] = -(auVar200[6] < '\0');
              auVar143._13_3_ = auVar144._13_3_;
              auVar143._0_12_ = auVar200._0_12_;
              auVar143[0xc] = auVar200[6];
              auVar142._12_4_ = auVar143._12_4_;
              auVar142._0_11_ = auVar200._0_11_;
              auVar142[0xb] = -(auVar200[5] < '\0');
              auVar141._11_5_ = auVar142._11_5_;
              auVar141._0_10_ = auVar200._0_10_;
              auVar141[10] = auVar200[5];
              auVar140._10_6_ = auVar141._10_6_;
              auVar140._0_9_ = auVar200._0_9_;
              auVar140[9] = -(auVar200[4] < '\0');
              auVar139._9_7_ = auVar140._9_7_;
              auVar139._0_8_ = auVar200._0_8_;
              auVar139[8] = auVar200[4];
              Var14 = CONCAT91(CONCAT81(auVar139._8_8_,-(auVar200[3] < '\0')),auVar200[3]);
              auVar28._2_10_ = Var14;
              auVar28[1] = -(auVar200[2] < '\0');
              auVar28[0] = auVar200[2];
              auVar27._2_12_ = auVar28;
              auVar27[1] = -(auVar200[1] < '\0');
              auVar27[0] = auVar200[1];
              auVar138._0_2_ = CONCAT11(-(auVar200[0] < '\0'),auVar200[0]);
              auVar138._2_14_ = auVar27;
              sVar107 = CONCAT11(-(auVar200[8] < '\0'),auVar200[8]);
              uVar85 = CONCAT13(-(auVar200[9] < '\0'),CONCAT12(auVar200[9],sVar107));
              uVar87 = CONCAT15(-(auVar200[10] < '\0'),CONCAT14(auVar200[10],uVar85));
              uVar88 = CONCAT17(-(auVar200[0xb] < '\0'),CONCAT16(auVar200[0xb],uVar87));
              auVar115._0_10_ = CONCAT19(-(auVar200[0xc] < '\0'),CONCAT18(auVar200[0xc],uVar88));
              auVar115[10] = auVar200[0xd];
              auVar115[0xb] = -(auVar200[0xd] < '\0');
              auVar116[0xc] = auVar200[0xe];
              auVar116._0_12_ = auVar115;
              auVar116[0xd] = -(auVar200[0xe] < '\0');
              auVar118[0xe] = auVar200[0xf];
              auVar118._0_14_ = auVar116;
              auVar118[0xf] = -(auVar200[0xf] < '\0');
              sVar61 = auVar23._0_2_;
              sVar78 = auVar24._0_2_;
              sVar100 = (short)Var8;
              sVar95 = sVar100 * (short)Var11;
              sVar62 = auVar172._8_2_;
              sVar63 = auVar174._10_2_;
              sVar103 = auVar176._12_2_;
              auVar158 = pmulhw(auVar150,auVar171);
              sVar84 = sVar100 * (short)((ulong)uVar123 >> 0x30);
              auVar200 = pmulhw(auVar129,auVar171);
              sVar79 = sVar100 * (short)Var14;
              auVar206 = pmulhw(auVar138,auVar171);
              sVar100 = sVar100 * (short)((ulong)uVar88 >> 0x30);
              auVar137 = pmulhw(auVar118,auVar171);
              iVar86 = CONCAT22(auVar158._6_2_,sVar95);
              Var8 = CONCAT64(CONCAT42(iVar86,auVar158._4_2_),
                              CONCAT22(sVar78 * auVar26._0_2_,sVar95));
              auVar29._4_8_ = (long)((unkuint10)Var8 >> 0x10);
              auVar29._2_2_ = auVar158._2_2_;
              auVar29._0_2_ = sVar61 * auVar25._0_2_;
              iVar94 = CONCAT22(auVar200._6_2_,sVar84);
              Var11 = CONCAT64(CONCAT42(iVar94,auVar200._4_2_),
                               CONCAT22(sVar78 * (short)((uint6)uVar122 >> 0x20),sVar84));
              auVar30._4_8_ = (long)((unkuint10)Var11 >> 0x10);
              auVar30._2_2_ = auVar200._2_2_;
              auVar30._0_2_ = sVar61 * (short)((uint)uVar121 >> 0x10);
              iVar96 = CONCAT22(auVar206._6_2_,sVar79);
              Var14 = CONCAT64(CONCAT42(iVar96,auVar206._4_2_),
                               CONCAT22(sVar78 * auVar28._0_2_,sVar79));
              auVar31._4_8_ = (long)((unkuint10)Var14 >> 0x10);
              auVar31._2_2_ = auVar206._2_2_;
              auVar31._0_2_ = sVar61 * auVar27._0_2_;
              iVar97 = CONCAT22(auVar137._6_2_,sVar100);
              Var33 = CONCAT64(CONCAT42(iVar97,auVar137._4_2_),
                               CONCAT22(sVar78 * (short)((uint6)uVar87 >> 0x20),sVar100));
              auVar32._4_8_ = (long)((unkuint10)Var33 >> 0x10);
              auVar32._2_2_ = auVar137._2_2_;
              auVar32._0_2_ = sVar61 * (short)((uint)uVar85 >> 0x10);
              iVar47 = CONCAT22(auVar158._8_2_,sVar62 * auVar151._8_2_);
              auVar52._0_8_ = CONCAT26(auVar158._10_2_,CONCAT24(sVar63 * auVar153._10_2_,iVar47));
              auVar52._8_2_ = sVar103 * auVar155._12_2_;
              auVar52._10_2_ = auVar158._12_2_;
              auVar60._12_2_ = auVar177._14_2_ * auVar156._14_2_;
              auVar60._0_12_ = auVar52;
              auVar60._14_2_ = auVar158._14_2_;
              iVar104 = iVar47 + CONCAT22(auVar158._0_2_,auVar171._0_2_ * auVar150._0_2_) + iVar104;
              iVar108 = (int)((ulong)auVar52._0_8_ >> 0x20) + auVar29._0_4_ + iVar108;
              iVar111 = auVar52._8_4_ + (int)((unkuint10)Var8 >> 0x10) + iVar111;
              iVar112 = auVar60._12_4_ + iVar86 + iVar112;
              iVar86 = CONCAT22(auVar200._8_2_,sVar62 * (short)((unkuint10)auVar125._0_10_ >> 0x40))
              ;
              auVar82._0_8_ = CONCAT26(auVar200._10_2_,CONCAT24(sVar63 * auVar125._10_2_,iVar86));
              auVar82._8_2_ = sVar103 * auVar127._12_2_;
              auVar82._10_2_ = auVar200._12_2_;
              auVar83._12_2_ = auVar177._14_2_ * auVar129._14_2_;
              auVar83._0_12_ = auVar82;
              auVar83._14_2_ = auVar200._14_2_;
              iVar185 = iVar86 + CONCAT22(auVar200._0_2_,auVar171._0_2_ * sVar109) + iVar185;
              iVar188 = (int)((ulong)auVar82._0_8_ >> 0x20) + auVar30._0_4_ + iVar188;
              iVar190 = auVar82._8_4_ + (int)((unkuint10)Var11 >> 0x10) + iVar190;
              iVar191 = auVar83._12_4_ + iVar94 + iVar191;
              iVar86 = CONCAT22(auVar206._8_2_,sVar62 * auVar139._8_2_);
              auVar66._0_8_ = CONCAT26(auVar206._10_2_,CONCAT24(sVar63 * auVar141._10_2_,iVar86));
              auVar66._8_2_ = sVar103 * auVar143._12_2_;
              auVar66._10_2_ = auVar206._12_2_;
              auVar76._12_2_ = auVar177._14_2_ * auVar144._14_2_;
              auVar76._0_12_ = auVar66;
              auVar76._14_2_ = auVar206._14_2_;
              iVar64 = iVar86 + CONCAT22(auVar206._0_2_,auVar171._0_2_ * auVar138._0_2_) + iVar64;
              iVar77 = (int)((ulong)auVar66._0_8_ >> 0x20) + auVar31._0_4_ + iVar77;
              iVar80 = auVar66._8_4_ + (int)((unkuint10)Var14 >> 0x10) + iVar80;
              iVar81 = auVar76._12_4_ + iVar96 + iVar81;
              iVar86 = CONCAT22(auVar137._8_2_,sVar62 * (short)((unkuint10)auVar115._0_10_ >> 0x40))
              ;
              auVar98._0_8_ = CONCAT26(auVar137._10_2_,CONCAT24(sVar63 * auVar115._10_2_,iVar86));
              auVar98._8_2_ = sVar103 * auVar116._12_2_;
              auVar98._10_2_ = auVar137._12_2_;
              auVar99._12_2_ = auVar177._14_2_ * auVar118._14_2_;
              auVar99._0_12_ = auVar98;
              auVar99._14_2_ = auVar137._14_2_;
              iVar146 = iVar86 + CONCAT22(auVar137._0_2_,auVar171._0_2_ * sVar107) + iVar146;
              iVar159 = (int)((ulong)auVar98._0_8_ >> 0x20) + auVar32._0_4_ + iVar159;
              iVar161 = auVar98._8_4_ + (int)((unkuint10)Var33 >> 0x10) + iVar161;
              iVar162 = auVar99._12_4_ + iVar97 + iVar162;
              pauVar38 = pauVar38 + 2;
              lVar35 = lVar35 + 1;
            } while (iVar46 != (int)lVar35);
          }
          *(int *)*pauVar36 = iVar112 + iVar111 + iVar108 + iVar104;
          *(int *)((long)*pauVar36 + 4) = iVar191 + iVar190 + iVar188 + iVar185;
          *(int *)((long)*pauVar36 + 8) = iVar81 + iVar80 + iVar77 + iVar64;
          *(int *)((long)*pauVar36 + 0xc) = iVar162 + iVar161 + iVar159 + iVar146;
          pauVar36 = pauVar36 + 1;
          uVar39 = (uint)uVar43 + 1;
          uVar43 = (ulong)uVar39;
        } while (uVar39 != uVar1);
      }
      uVar37 = uVar37 + 1;
    } while (uVar37 != uVar3);
  }
  piVar5 = (int *)CONCAT44(local_148._12_4_,local_148._8_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if ((Allocator *)local_148._32_8_ == (Allocator *)0x0) {
        if ((void *)local_148._0_8_ != (void *)0x0) {
          free((void *)local_148._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_148._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack8to4_int8_sse(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 8u, 8, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    // permute
    Mat tmp;
    if (size >= 2)
        tmp.create(2 * maxk, inch, size / 2 + size % 2, 8u, 8, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 8u, 8, opt.workspace_allocator);
    {
        int remain_size_start = 0;
        int nn_size = size >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            int64_t* tmpptr = tmp.channel(i / 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    __m128i _v = _mm_loadu_si128((const __m128i*)img0);
                    _mm_storeu_si128((__m128i*)tmpptr, _v);
                    tmpptr += 2;
                    img0 += size;
                }
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            int64_t* tmpptr = tmp.channel(i / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                const int64_t* img0 = (const int64_t*)bottom_im2col.channel(q) + i;

                for (int k = 0; k < maxk; k++)
                {
                    tmpptr[0] = img0[0];
                    tmpptr += 1;
                    img0 += size;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        int* outptr0 = top_blob.channel(p);

        int i = 0;
        for (; i + 1 < size; i += 2)
        {
            const signed char* tmpptr = tmp.channel(i / 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum00 = _mm_setzero_si128();
            __m128i _sum01 = _mm_setzero_si128();
            __m128i _sum02 = _mm_setzero_si128();
            __m128i _sum03 = _mm_setzero_si128();
            __m128i _sum10 = _mm_setzero_si128();
            __m128i _sum11 = _mm_setzero_si128();
            __m128i _sum12 = _mm_setzero_si128();
            __m128i _sum13 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val01 = _mm_loadu_si128((const __m128i*)tmpptr);
                __m128i _extval01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _val01);
                __m128i _val0 = _mm_unpacklo_epi8(_val01, _extval01);
                __m128i _val1 = _mm_unpackhi_epi8(_val01, _extval01);

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl00 = _mm_mullo_epi16(_val0, _w0);
                __m128i _sh00 = _mm_mulhi_epi16(_val0, _w0);
                __m128i _sl01 = _mm_mullo_epi16(_val0, _w1);
                __m128i _sh01 = _mm_mulhi_epi16(_val0, _w1);
                __m128i _sl02 = _mm_mullo_epi16(_val0, _w2);
                __m128i _sh02 = _mm_mulhi_epi16(_val0, _w2);
                __m128i _sl03 = _mm_mullo_epi16(_val0, _w3);
                __m128i _sh03 = _mm_mulhi_epi16(_val0, _w3);
                __m128i _sl10 = _mm_mullo_epi16(_val1, _w0);
                __m128i _sh10 = _mm_mulhi_epi16(_val1, _w0);
                __m128i _sl11 = _mm_mullo_epi16(_val1, _w1);
                __m128i _sh11 = _mm_mulhi_epi16(_val1, _w1);
                __m128i _sl12 = _mm_mullo_epi16(_val1, _w2);
                __m128i _sh12 = _mm_mulhi_epi16(_val1, _w2);
                __m128i _sl13 = _mm_mullo_epi16(_val1, _w3);
                __m128i _sh13 = _mm_mulhi_epi16(_val1, _w3);

                _sum00 = _mm_add_epi32(_sum00, _mm_unpacklo_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpacklo_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpacklo_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpacklo_epi16(_sl03, _sh03));
                _sum00 = _mm_add_epi32(_sum00, _mm_unpackhi_epi16(_sl00, _sh00));
                _sum01 = _mm_add_epi32(_sum01, _mm_unpackhi_epi16(_sl01, _sh01));
                _sum02 = _mm_add_epi32(_sum02, _mm_unpackhi_epi16(_sl02, _sh02));
                _sum03 = _mm_add_epi32(_sum03, _mm_unpackhi_epi16(_sl03, _sh03));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpacklo_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpacklo_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpacklo_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpacklo_epi16(_sl13, _sh13));
                _sum10 = _mm_add_epi32(_sum10, _mm_unpackhi_epi16(_sl10, _sh10));
                _sum11 = _mm_add_epi32(_sum11, _mm_unpackhi_epi16(_sl11, _sh11));
                _sum12 = _mm_add_epi32(_sum12, _mm_unpackhi_epi16(_sl12, _sh12));
                _sum13 = _mm_add_epi32(_sum13, _mm_unpackhi_epi16(_sl13, _sh13));

                tmpptr += 16;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum00, _sum01);
                _tmp1 = _mm_unpacklo_epi32(_sum02, _sum03);
                _tmp2 = _mm_unpackhi_epi32(_sum00, _sum01);
                _tmp3 = _mm_unpackhi_epi32(_sum02, _sum03);
                _sum00 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum01 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum02 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum03 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum10, _sum11);
                _tmp1 = _mm_unpacklo_epi32(_sum12, _sum13);
                _tmp2 = _mm_unpackhi_epi32(_sum10, _sum11);
                _tmp3 = _mm_unpackhi_epi32(_sum12, _sum13);
                _sum10 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum11 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum12 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum13 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum00 = _mm_add_epi32(_sum00, _sum01);
            _sum02 = _mm_add_epi32(_sum02, _sum03);
            _sum10 = _mm_add_epi32(_sum10, _sum11);
            _sum12 = _mm_add_epi32(_sum12, _sum13);

            _sum00 = _mm_add_epi32(_sum00, _sum02);
            _sum10 = _mm_add_epi32(_sum10, _sum12);

            _mm_storeu_si128((__m128i*)outptr0, _sum00);
            _mm_storeu_si128((__m128i*)(outptr0 + 4), _sum10);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            const signed char* tmpptr = tmp.channel(i / 2 + i % 2);
            const signed char* kptr0 = kernel.channel(p);

            int nn = inch * maxk; // inch always > 0

            __m128i _sum0 = _mm_setzero_si128();
            __m128i _sum1 = _mm_setzero_si128();
            __m128i _sum2 = _mm_setzero_si128();
            __m128i _sum3 = _mm_setzero_si128();

            int j = 0;
            for (; j < nn; j++)
            {
                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _val = _mm_loadl_epi64((const __m128i*)tmpptr);
                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                // TODO use _mm_cvtepi8_epi16 on sse4.1
                __m128i _w01 = _mm_loadu_si128((const __m128i*)kptr0);
                __m128i _w23 = _mm_loadu_si128((const __m128i*)(kptr0 + 16));
                __m128i _extw01 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w01);
                __m128i _extw23 = _mm_cmpgt_epi8(_mm_setzero_si128(), _w23);
                __m128i _w0 = _mm_unpacklo_epi8(_w01, _extw01);
                __m128i _w1 = _mm_unpackhi_epi8(_w01, _extw01);
                __m128i _w2 = _mm_unpacklo_epi8(_w23, _extw23);
                __m128i _w3 = _mm_unpackhi_epi8(_w23, _extw23);

                __m128i _sl0 = _mm_mullo_epi16(_val, _w0);
                __m128i _sh0 = _mm_mulhi_epi16(_val, _w0);
                __m128i _sl1 = _mm_mullo_epi16(_val, _w1);
                __m128i _sh1 = _mm_mulhi_epi16(_val, _w1);
                __m128i _sl2 = _mm_mullo_epi16(_val, _w2);
                __m128i _sh2 = _mm_mulhi_epi16(_val, _w2);
                __m128i _sl3 = _mm_mullo_epi16(_val, _w3);
                __m128i _sh3 = _mm_mulhi_epi16(_val, _w3);

                _sum0 = _mm_add_epi32(_sum0, _mm_unpacklo_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpacklo_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpacklo_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpacklo_epi16(_sl3, _sh3));
                _sum0 = _mm_add_epi32(_sum0, _mm_unpackhi_epi16(_sl0, _sh0));
                _sum1 = _mm_add_epi32(_sum1, _mm_unpackhi_epi16(_sl1, _sh1));
                _sum2 = _mm_add_epi32(_sum2, _mm_unpackhi_epi16(_sl2, _sh2));
                _sum3 = _mm_add_epi32(_sum3, _mm_unpackhi_epi16(_sl3, _sh3));

                tmpptr += 8;
                kptr0 += 32;
            }

            // transpose 4x4
            {
                __m128i _tmp0, _tmp1, _tmp2, _tmp3;
                _tmp0 = _mm_unpacklo_epi32(_sum0, _sum1);
                _tmp1 = _mm_unpacklo_epi32(_sum2, _sum3);
                _tmp2 = _mm_unpackhi_epi32(_sum0, _sum1);
                _tmp3 = _mm_unpackhi_epi32(_sum2, _sum3);
                _sum0 = _mm_unpacklo_epi64(_tmp0, _tmp1);
                _sum1 = _mm_unpackhi_epi64(_tmp0, _tmp1);
                _sum2 = _mm_unpacklo_epi64(_tmp2, _tmp3);
                _sum3 = _mm_unpackhi_epi64(_tmp2, _tmp3);
            }

            _sum0 = _mm_add_epi32(_sum0, _sum1);
            _sum2 = _mm_add_epi32(_sum2, _sum3);

            _sum0 = _mm_add_epi32(_sum0, _sum2);

            _mm_storeu_si128((__m128i*)outptr0, _sum0);
            outptr0 += 4;
        }
    }
}